

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

RegSlot __thiscall ByteCodeGenerator::AssignTrueConstRegister(ByteCodeGenerator *this)

{
  RegSlot RVar1;
  Type *ppFVar2;
  
  ppFVar2 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  RVar1 = FuncInfo::AssignTrueConstRegister(*ppFVar2);
  return RVar1;
}

Assistant:

Js::RegSlot ByteCodeGenerator::AssignTrueConstRegister()
{
    FuncInfo *top = funcInfoStack->Top();
    return top->AssignTrueConstRegister();
}